

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<QToolBarAreaLayoutItem>::growAppend
          (QCommonArrayOps<QToolBarAreaLayoutItem> *this,QToolBarAreaLayoutItem *b,
          QToolBarAreaLayoutItem *e)

{
  QToolBarAreaLayoutItem *pQVar1;
  QToolBarAreaLayoutItem **data;
  QArrayDataPointer<QToolBarAreaLayoutItem> *old;
  long in_FS_OFFSET;
  QArrayDataPointer<QToolBarAreaLayoutItem> local_38;
  QToolBarAreaLayoutItem *local_20;
  long local_18;
  
  old = &local_38;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = b;
  if (b != e) {
    local_38.d = (Data *)0x0;
    local_38.ptr = (QToolBarAreaLayoutItem *)0x0;
    local_38.size = 0;
    pQVar1 = (this->super_Type).super_QArrayDataPointer<QToolBarAreaLayoutItem>.ptr;
    if ((b < pQVar1) ||
       (pQVar1 + (this->super_Type).super_QArrayDataPointer<QToolBarAreaLayoutItem>.size <= b)) {
      data = (QToolBarAreaLayoutItem **)0x0;
      old = (QArrayDataPointer<QToolBarAreaLayoutItem> *)0x0;
    }
    else {
      data = &local_20;
    }
    QArrayDataPointer<QToolBarAreaLayoutItem>::detachAndGrow
              ((QArrayDataPointer<QToolBarAreaLayoutItem> *)this,GrowsAtEnd,
               ((long)e - (long)b >> 3) * -0x5555555555555555,data,old);
    QPodArrayOps<QToolBarAreaLayoutItem>::copyAppend
              (&this->super_Type,local_20,
               (QToolBarAreaLayoutItem *)(((long)e - (long)b) + (long)local_20));
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x18,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }